

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

string * __thiscall
spvtools::opt::Instruction::PrettyPrint_abi_cxx11_
          (string *__return_storage_ptr__,Instruction *this,uint32_t options)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> inst_binary;
  vector<unsigned_int,_std::allocator<unsigned_int>_> module_binary;
  undefined4 in_stack_ffffffffffffff8c;
  uint32_t in_stack_ffffffffffffff90;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Module::ToBinary((this->context_->module_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                   .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,false);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ToBinaryWithoutAttachedDebugInsts
            (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68);
  spvInstructionBinaryToText_abi_cxx11_
            (__return_storage_ptr__,(spvtools *)(ulong)(this->context_->grammar_).target_env_,
             (spv_target_env)local_68._M_impl.super__Vector_impl_data._M_start,
             (uint32_t *)
             ((long)local_68._M_impl.super__Vector_impl_data._M_finish -
              (long)local_68._M_impl.super__Vector_impl_data._M_start >> 2),
             (size_t)local_48._M_impl.super__Vector_impl_data._M_start,
             (uint32_t *)
             ((long)local_48._M_impl.super__Vector_impl_data._M_finish -
              (long)local_48._M_impl.super__Vector_impl_data._M_start >> 2),
             CONCAT44(in_stack_ffffffffffffff8c,options) | 0x20,in_stack_ffffffffffffff90);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string Instruction::PrettyPrint(uint32_t options) const {
  // Convert the module to binary.
  std::vector<uint32_t> module_binary;
  context()->module()->ToBinary(&module_binary, /* skip_nop = */ false);

  // Convert the instruction to binary. This is used to identify the correct
  // stream of words to output from the module.
  std::vector<uint32_t> inst_binary;
  ToBinaryWithoutAttachedDebugInsts(&inst_binary);

  // Do not generate a header.
  return spvInstructionBinaryToText(
      context()->grammar().target_env(), inst_binary.data(), inst_binary.size(),
      module_binary.data(), module_binary.size(),
      options | SPV_BINARY_TO_TEXT_OPTION_NO_HEADER);
}